

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O1

ENetPeer *
enet_protocol_handle_connect(ENetHost *host,ENetProtocolHeader *header,ENetProtocol *command)

{
  byte bVar1;
  ENetProtocolHeader EVar2;
  ulong uVar3;
  ENetChannel *pEVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  ENetPeer *pEVar8;
  uint uVar9;
  ENetPeer *pEVar10;
  ENetPeer *peer;
  enet_uint32 eVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ENetProtocol verifyCommand;
  ENetProtocol local_60;
  
  EVar2 = header[4];
  uVar14 = (uint)EVar2 >> 0x18 | ((uint)EVar2 & 0xff0000) >> 8 | ((uint)EVar2 & 0xff00) << 8 |
           (int)EVar2 << 0x18;
  if (uVar14 - 0x100 < 0xffffff01) {
    return (ENetPeer *)0x0;
  }
  if ((long)host->peerCount < 1) {
    uVar3 = 0;
    peer = (ENetPeer *)0x0;
  }
  else {
    pEVar8 = host->peers;
    pEVar10 = pEVar8 + host->peerCount;
    peer = (ENetPeer *)0x0;
    uVar3 = 0;
    do {
      if (pEVar8->state != ENET_PEER_STATE_CONNECTING) {
        if (pEVar8->state == ENET_PEER_STATE_DISCONNECTED) {
          if (peer == (ENetPeer *)0x0) {
            peer = pEVar8;
          }
        }
        else if ((pEVar8->address).host == (host->receivedAddress).host) {
          if (((pEVar8->address).port == (host->receivedAddress).port) &&
             ((ENetProtocolHeader)pEVar8->connectID == header[10])) {
            return (ENetPeer *)0x0;
          }
          uVar3 = uVar3 + 1;
        }
      }
      pEVar8 = pEVar8 + 1;
    } while (pEVar8 < pEVar10);
  }
  if (peer == (ENetPeer *)0x0) {
    return (ENetPeer *)0x0;
  }
  if (host->duplicatePeers <= uVar3) {
    return (ENetPeer *)0x0;
  }
  uVar3 = (ulong)uVar14;
  if (host->channelLimit < (ulong)uVar14) {
    uVar3 = host->channelLimit;
  }
  pEVar4 = (ENetChannel *)enet_malloc(uVar3 * 0x50);
  peer->channels = pEVar4;
  if (pEVar4 == (ENetChannel *)0x0) {
    return (ENetPeer *)0x0;
  }
  peer->channelCount = uVar3;
  peer->state = ENET_PEER_STATE_ACKNOWLEDGING_CONNECT;
  peer->connectID = (enet_uint32)header[10];
  peer->address = host->receivedAddress;
  peer->outgoingPeerID = header[1].peerID << 8 | header[1].peerID >> 8;
  EVar2 = header[5];
  peer->incomingBandwidth =
       (uint)EVar2 >> 0x18 | ((uint)EVar2 & 0xff0000) >> 8 | ((uint)EVar2 & 0xff00) << 8 |
       (int)EVar2 << 0x18;
  EVar2 = header[6];
  peer->outgoingBandwidth =
       (uint)EVar2 >> 0x18 | ((uint)EVar2 & 0xff0000) >> 8 | ((uint)EVar2 & 0xff00) << 8 |
       (int)EVar2 << 0x18;
  EVar2 = header[7];
  peer->packetThrottleInterval =
       (uint)EVar2 >> 0x18 | ((uint)EVar2 & 0xff0000) >> 8 | ((uint)EVar2 & 0xff00) << 8 |
       (int)EVar2 << 0x18;
  EVar2 = header[8];
  peer->packetThrottleAcceleration =
       (uint)EVar2 >> 0x18 | ((uint)EVar2 & 0xff0000) >> 8 | ((uint)EVar2 & 0xff00) << 8 |
       (int)EVar2 << 0x18;
  EVar2 = header[9];
  peer->packetThrottleDeceleration =
       (uint)EVar2 >> 0x18 | ((uint)EVar2 & 0xff0000) >> 8 | ((uint)EVar2 & 0xff00) << 8 |
       (int)EVar2 << 0x18;
  EVar2 = header[0xb];
  peer->eventData =
       (uint)EVar2 >> 0x18 | ((uint)EVar2 & 0xff0000) >> 8 | ((uint)EVar2 & 0xff00) << 8 |
       (int)EVar2 << 0x18;
  bVar1 = (byte)header[1].sentTime;
  if (bVar1 == 0xff) {
    bVar1 = peer->outgoingSessionID;
  }
  bVar5 = bVar1 + 1 & 3;
  if (bVar5 == peer->outgoingSessionID) {
    bVar5 = bVar1 & 3 ^ 2;
  }
  peer->outgoingSessionID = bVar5;
  bVar1 = *(byte *)((long)&header[1].sentTime + 1);
  if (bVar1 == 0xff) {
    bVar1 = peer->incomingSessionID;
  }
  bVar6 = bVar1 + 1 & 3;
  if (bVar6 == peer->incomingSessionID) {
    bVar6 = bVar1 & 3 ^ 2;
  }
  peer->incomingSessionID = bVar6;
  if (pEVar4 < peer->channels + uVar3) {
    do {
      pEVar4->outgoingReliableSequenceNumber = 0;
      pEVar4->outgoingUnreliableSequenceNumber = 0;
      pEVar4->incomingReliableSequenceNumber = 0;
      pEVar4->incomingUnreliableSequenceNumber = 0;
      enet_list_clear(&pEVar4->incomingReliableCommands);
      enet_list_clear(&pEVar4->incomingUnreliableCommands);
      pEVar4->reliableWindows[7] = 0;
      pEVar4->reliableWindows[8] = 0;
      pEVar4->reliableWindows[9] = 0;
      pEVar4->reliableWindows[10] = 0;
      pEVar4->reliableWindows[0xb] = 0;
      pEVar4->reliableWindows[0xc] = 0;
      pEVar4->reliableWindows[0xd] = 0;
      pEVar4->reliableWindows[0xe] = 0;
      pEVar4->usedReliableWindows = 0;
      pEVar4->reliableWindows[0] = 0;
      pEVar4->reliableWindows[1] = 0;
      pEVar4->reliableWindows[2] = 0;
      pEVar4->reliableWindows[3] = 0;
      pEVar4->reliableWindows[4] = 0;
      pEVar4->reliableWindows[5] = 0;
      pEVar4->reliableWindows[6] = 0;
      pEVar4->reliableWindows[0xf] = 0;
      pEVar4 = pEVar4 + 1;
    } while (pEVar4 < peer->channels + uVar3);
  }
  EVar2 = header[2];
  uVar14 = (uint)EVar2 >> 0x18 | ((uint)EVar2 & 0xff0000) >> 8 | ((uint)EVar2 & 0xff00) << 8 |
           (int)EVar2 << 0x18;
  if (0xfff < uVar14) {
    uVar14 = 0x1000;
  }
  uVar7 = 0x240;
  if (0x240 < uVar14) {
    uVar7 = uVar14;
  }
  peer->mtu = uVar7;
  uVar14 = host->outgoingBandwidth;
  if (uVar14 == 0) {
    if (peer->incomingBandwidth != 0) goto LAB_00162502;
    uVar9 = 0x10000;
  }
  else {
    uVar9 = peer->incomingBandwidth;
    if (uVar9 == 0) {
LAB_00162502:
      uVar9 = peer->incomingBandwidth;
      if (peer->incomingBandwidth < uVar14) {
        uVar9 = uVar14;
      }
    }
    else if (uVar14 < uVar9) {
      uVar9 = uVar14;
    }
    uVar9 = uVar9 >> 4 & 0xffff000;
  }
  peer->windowSize = uVar9;
  if (uVar9 == 0) {
    eVar11 = 0x1000;
  }
  else {
    eVar11 = 0x10000;
    if (uVar9 < 0x10001) goto LAB_00162537;
  }
  peer->windowSize = eVar11;
LAB_00162537:
  uVar9 = host->incomingBandwidth;
  uVar12 = uVar9 >> 4 & 0xffff000;
  if (uVar9 == 0) {
    uVar12 = 0x10000;
  }
  EVar2 = header[3];
  uVar13 = (uint)EVar2 >> 0x18 | ((uint)EVar2 & 0xff0000) >> 8 | ((uint)EVar2 & 0xff00) << 8 |
           (int)EVar2 << 0x18;
  if (uVar12 < uVar13) {
    uVar13 = uVar12;
  }
  if (0xffff < uVar13) {
    uVar13 = 0x10000;
  }
  uVar12 = 0x1000;
  if (0x1000 < uVar13) {
    uVar12 = uVar13;
  }
  local_60._0_2_ = 0xff83;
  local_60.acknowledge.receivedReliableSequenceNumber =
       peer->incomingPeerID << 8 | peer->incomingPeerID >> 8;
  local_60.connect.mtu =
       uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  local_60.connect.windowSize =
       uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
  local_60.connect.channelCount = (int)uVar3 << 0x18;
  local_60.connect.incomingBandwidth =
       uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  local_60.connect.outgoingBandwidth =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar14 = peer->packetThrottleInterval;
  local_60.connect.packetThrottleInterval =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar14 = peer->packetThrottleAcceleration;
  local_60.connect.packetThrottleAcceleration =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar14 = peer->packetThrottleDeceleration;
  local_60.connect.packetThrottleDeceleration =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  local_60.connect.connectID = peer->connectID;
  local_60.connect.incomingSessionID = bVar5;
  local_60.connect.outgoingSessionID = bVar6;
  enet_peer_queue_outgoing_command(peer,&local_60,(ENetPacket *)0x0,0,0);
  return peer;
}

Assistant:

static ENetPeer *
enet_protocol_handle_connect (ENetHost * host, ENetProtocolHeader * header, ENetProtocol * command)
{
    enet_uint8 incomingSessionID, outgoingSessionID;
    enet_uint32 mtu, windowSize;
    ENetChannel * channel;
    size_t channelCount, duplicatePeers = 0;
    ENetPeer * currentPeer, * peer = NULL;
    ENetProtocol verifyCommand;

    channelCount = ENET_NET_TO_HOST_32 (command -> connect.channelCount);

    if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT ||
        channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      return NULL;

    for (currentPeer = host -> peers;
         currentPeer < & host -> peers [host -> peerCount];
         ++ currentPeer)
    {
        if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED)
        {
            if (peer == NULL)
              peer = currentPeer;
        }
        else 
        if (currentPeer -> state != ENET_PEER_STATE_CONNECTING &&
            currentPeer -> address.host == host -> receivedAddress.host)
        {
            if (currentPeer -> address.port == host -> receivedAddress.port &&
                currentPeer -> connectID == command -> connect.connectID)
              return NULL;

            ++ duplicatePeers;
        }
    }

    if (peer == NULL || duplicatePeers >= host -> duplicatePeers)
      return NULL;

    if (channelCount > host -> channelLimit)
      channelCount = host -> channelLimit;
    peer -> channels = (ENetChannel *) enet_malloc (channelCount * sizeof (ENetChannel));
    if (peer -> channels == NULL)
      return NULL;
    peer -> channelCount = channelCount;
    peer -> state = ENET_PEER_STATE_ACKNOWLEDGING_CONNECT;
    peer -> connectID = command -> connect.connectID;
    peer -> address = host -> receivedAddress;
    peer -> outgoingPeerID = ENET_NET_TO_HOST_16 (command -> connect.outgoingPeerID);
    peer -> incomingBandwidth = ENET_NET_TO_HOST_32 (command -> connect.incomingBandwidth);
    peer -> outgoingBandwidth = ENET_NET_TO_HOST_32 (command -> connect.outgoingBandwidth);
    peer -> packetThrottleInterval = ENET_NET_TO_HOST_32 (command -> connect.packetThrottleInterval);
    peer -> packetThrottleAcceleration = ENET_NET_TO_HOST_32 (command -> connect.packetThrottleAcceleration);
    peer -> packetThrottleDeceleration = ENET_NET_TO_HOST_32 (command -> connect.packetThrottleDeceleration);
    peer -> eventData = ENET_NET_TO_HOST_32 (command -> connect.data);

    incomingSessionID = command -> connect.incomingSessionID == 0xFF ? peer -> outgoingSessionID : command -> connect.incomingSessionID;
    incomingSessionID = (incomingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
    if (incomingSessionID == peer -> outgoingSessionID)
      incomingSessionID = (incomingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
    peer -> outgoingSessionID = incomingSessionID;

    outgoingSessionID = command -> connect.outgoingSessionID == 0xFF ? peer -> incomingSessionID : command -> connect.outgoingSessionID;
    outgoingSessionID = (outgoingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
    if (outgoingSessionID == peer -> incomingSessionID)
      outgoingSessionID = (outgoingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
    peer -> incomingSessionID = outgoingSessionID;

    for (channel = peer -> channels;
         channel < & peer -> channels [channelCount];
         ++ channel)
    {
        channel -> outgoingReliableSequenceNumber = 0;
        channel -> outgoingUnreliableSequenceNumber = 0;
        channel -> incomingReliableSequenceNumber = 0;
        channel -> incomingUnreliableSequenceNumber = 0;

        enet_list_clear (& channel -> incomingReliableCommands);
        enet_list_clear (& channel -> incomingUnreliableCommands);

        channel -> usedReliableWindows = 0;
        memset (channel -> reliableWindows, 0, sizeof (channel -> reliableWindows));
    }

    mtu = ENET_NET_TO_HOST_32 (command -> connect.mtu);

    if (mtu < ENET_PROTOCOL_MINIMUM_MTU)
      mtu = ENET_PROTOCOL_MINIMUM_MTU;
    else
    if (mtu > ENET_PROTOCOL_MAXIMUM_MTU)
      mtu = ENET_PROTOCOL_MAXIMUM_MTU;

    peer -> mtu = mtu;

    if (host -> outgoingBandwidth == 0 &&
        peer -> incomingBandwidth == 0)
      peer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    else
    if (host -> outgoingBandwidth == 0 ||
        peer -> incomingBandwidth == 0)
      peer -> windowSize = (ENET_MAX (host -> outgoingBandwidth, peer -> incomingBandwidth) /
                                    ENET_PEER_WINDOW_SIZE_SCALE) *
                                      ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
      peer -> windowSize = (ENET_MIN (host -> outgoingBandwidth, peer -> incomingBandwidth) /
                                    ENET_PEER_WINDOW_SIZE_SCALE) * 
                                      ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

    if (peer -> windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
      peer -> windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
    if (peer -> windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
      peer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;

    if (host -> incomingBandwidth == 0)
      windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    else
      windowSize = (host -> incomingBandwidth / ENET_PEER_WINDOW_SIZE_SCALE) *
                     ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

    if (windowSize > ENET_NET_TO_HOST_32 (command -> connect.windowSize))
      windowSize = ENET_NET_TO_HOST_32 (command -> connect.windowSize);

    if (windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
      windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
    if (windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
      windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;

    verifyCommand.header.command = ENET_PROTOCOL_COMMAND_VERIFY_CONNECT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
    verifyCommand.header.channelID = 0xFF;
    verifyCommand.verifyConnect.outgoingPeerID = ENET_HOST_TO_NET_16 (peer -> incomingPeerID);
    verifyCommand.verifyConnect.incomingSessionID = incomingSessionID;
    verifyCommand.verifyConnect.outgoingSessionID = outgoingSessionID;
    verifyCommand.verifyConnect.mtu = ENET_HOST_TO_NET_32 (peer -> mtu);
    verifyCommand.verifyConnect.windowSize = ENET_HOST_TO_NET_32 (windowSize);
    verifyCommand.verifyConnect.channelCount = ENET_HOST_TO_NET_32 (channelCount);
    verifyCommand.verifyConnect.incomingBandwidth = ENET_HOST_TO_NET_32 (host -> incomingBandwidth);
    verifyCommand.verifyConnect.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);
    verifyCommand.verifyConnect.packetThrottleInterval = ENET_HOST_TO_NET_32 (peer -> packetThrottleInterval);
    verifyCommand.verifyConnect.packetThrottleAcceleration = ENET_HOST_TO_NET_32 (peer -> packetThrottleAcceleration);
    verifyCommand.verifyConnect.packetThrottleDeceleration = ENET_HOST_TO_NET_32 (peer -> packetThrottleDeceleration);
    verifyCommand.verifyConnect.connectID = peer -> connectID;

    enet_peer_queue_outgoing_command (peer, & verifyCommand, NULL, 0, 0);

    return peer;
}